

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O0

bool IsStandardTx(CTransaction *tx,optional<unsigned_int> *max_datacarrier_bytes,
                 bool permit_bare_multisig,CFeeRate *dust_relay_fee,string *reason)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  CTxOut *txout_00;
  CScript *in_RCX;
  byte in_DL;
  long in_RDI;
  optional<unsigned_int> *in_R8;
  long in_FS_OFFSET;
  CTxOut *txout;
  vector<CTxOut,_std::allocator<CTxOut>_> *__range1_1;
  uint nDataOut;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  uint sz;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  TxoutType whichType;
  const_iterator __end1;
  const_iterator __begin1;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  reference in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  uint local_7c;
  undefined4 in_stack_ffffffffffffff98;
  bool local_31;
  int local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)(in_RDI + 0x30) < 4) && (*(int *)(in_RDI + 0x30) != 0)) {
    uVar3 = GetTransactionWeight
                      ((CTransaction *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)
                      );
    if (uVar3 < 0x61a81) {
      std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff70);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff70);
      while (bVar2 = __gnu_cxx::
                     operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                 *)in_stack_ffffffffffffff78,
                                (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                 *)in_stack_ffffffffffffff70), ((bVar2 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
        operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                  CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        sVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                           in_stack_ffffffffffffff78);
        if (0x672 < sVar4) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
          local_31 = false;
          goto LAB_00e15171;
        }
        bVar2 = CScript::IsPushOnly((CScript *)in_stack_ffffffffffffff78);
        if (!bVar2) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
          local_31 = false;
          goto LAB_00e15171;
        }
        __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
        operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                   CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      }
      local_7c = 0;
      txout_00 = (CTxOut *)(in_RDI + 0x18);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::begin
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff70);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::end
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff70);
      while (bVar2 = __gnu_cxx::
                     operator==<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                               ((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                                 *)txout_00,
                                (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                                 *)in_stack_ffffffffffffff70), ((bVar2 ^ 0xffU) & 1) != 0) {
        in_stack_ffffffffffffff70 =
             __gnu_cxx::
             __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
             operator*((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        bVar2 = IsStandard(in_RCX,in_R8,(TxoutType *)CONCAT44(uVar3,in_stack_ffffffffffffff98));
        if (!bVar2) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)txout_00,
                     (char *)in_stack_ffffffffffffff70);
          local_31 = false;
          goto LAB_00e15171;
        }
        if (local_1c == 6) {
          local_7c = local_7c + 1;
        }
        else {
          if ((local_1c == 5) && ((in_DL & 1) == 0)) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)txout_00,
                      (char *)in_stack_ffffffffffffff70);
            local_31 = false;
            goto LAB_00e15171;
          }
          bVar2 = IsDust(txout_00,(CFeeRate *)in_stack_ffffffffffffff70);
          if (bVar2) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)txout_00,
                      (char *)in_stack_ffffffffffffff70);
            local_31 = false;
            goto LAB_00e15171;
          }
        }
        __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
        ::operator++((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      }
      if (local_7c < 2) {
        local_31 = true;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)txout_00,
                   (char *)in_stack_ffffffffffffff70);
        local_31 = false;
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
      local_31 = false;
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
    local_31 = false;
  }
LAB_00e15171:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_31;
}

Assistant:

bool IsStandardTx(const CTransaction& tx, const std::optional<unsigned>& max_datacarrier_bytes, bool permit_bare_multisig, const CFeeRate& dust_relay_fee, std::string& reason)
{
    if (tx.version > TX_MAX_STANDARD_VERSION || tx.version < 1) {
        reason = "version";
        return false;
    }

    // Extremely large transactions with lots of inputs can cost the network
    // almost as much to process as they cost the sender in fees, because
    // computing signature hashes is O(ninputs*txsize). Limiting transactions
    // to MAX_STANDARD_TX_WEIGHT mitigates CPU exhaustion attacks.
    unsigned int sz = GetTransactionWeight(tx);
    if (sz > MAX_STANDARD_TX_WEIGHT) {
        reason = "tx-size";
        return false;
    }

    for (const CTxIn& txin : tx.vin)
    {
        // Biggest 'standard' txin involving only keys is a 15-of-15 P2SH
        // multisig with compressed keys (remember the MAX_SCRIPT_ELEMENT_SIZE byte limit on
        // redeemScript size). That works out to a (15*(33+1))+3=513 byte
        // redeemScript, 513+1+15*(73+1)+3=1627 bytes of scriptSig, which
        // we round off to 1650(MAX_STANDARD_SCRIPTSIG_SIZE) bytes for
        // some minor future-proofing. That's also enough to spend a
        // 20-of-20 CHECKMULTISIG scriptPubKey, though such a scriptPubKey
        // is not considered standard.
        if (txin.scriptSig.size() > MAX_STANDARD_SCRIPTSIG_SIZE) {
            reason = "scriptsig-size";
            return false;
        }
        if (!txin.scriptSig.IsPushOnly()) {
            reason = "scriptsig-not-pushonly";
            return false;
        }
    }

    unsigned int nDataOut = 0;
    TxoutType whichType;
    for (const CTxOut& txout : tx.vout) {
        if (!::IsStandard(txout.scriptPubKey, max_datacarrier_bytes, whichType)) {
            reason = "scriptpubkey";
            return false;
        }

        if (whichType == TxoutType::NULL_DATA)
            nDataOut++;
        else if ((whichType == TxoutType::MULTISIG) && (!permit_bare_multisig)) {
            reason = "bare-multisig";
            return false;
        } else if (IsDust(txout, dust_relay_fee)) {
            reason = "dust";
            return false;
        }
    }

    // only one OP_RETURN txout is permitted
    if (nDataOut > 1) {
        reason = "multi-op-return";
        return false;
    }

    return true;
}